

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O3

bool lunasvg::parseSelectors(string_view *input,SelectorList *selectors)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  byte bVar4;
  undefined8 uVar5;
  Combinator CVar6;
  PropertyID PVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  byte *pbVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  byte *pbVar16;
  size_t sVar17;
  ulong uVar18;
  size_t __n;
  byte *pbVar19;
  char cVar20;
  char cVar21;
  char *__s;
  size_t sVar22;
  AttributeSelector a;
  string name;
  Selector selector;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  byte local_c9;
  PseudoClassSelector local_c8;
  string_view local_a8;
  Combinator local_94;
  SimpleSelector local_90;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> local_58;
  char *local_40;
  vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
  *local_38;
  
  local_38 = (vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
              *)selectors;
  do {
    local_58.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CVar6 = None;
    do {
      do {
        do {
          local_94 = CVar6;
          local_90.id = Star;
          local_90.pseudoClassSelectors.
          super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_90.pseudoClassSelectors.
          super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_90.attributeSelectors.
          super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_90.pseudoClassSelectors.
          super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_90.attributeSelectors.
          super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_90.attributeSelectors.
          super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8._0_8_ = local_f8 + 0x10;
          local_f8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
          local_90.combinator = local_94;
          if (input->_M_len == 0) {
            bVar8 = false;
LAB_0011b83a:
            local_c9 = bVar8 ^ 1;
LAB_0011b83e:
            local_c9 = local_94 == Descendant & local_c9;
            bVar9 = false;
          }
          else {
            bVar1 = *input->_M_str;
            cVar20 = (char)local_f8;
            if (bVar1 == 0x2a) {
              input->_M_str = input->_M_str + 1;
              sVar17 = input->_M_len - 1;
              input->_M_len = sVar17;
              local_90.id = Star;
              bVar9 = true;
            }
            else {
              if ((((int)(char)(bVar1 & 0xdf) - 0x41U < 0x1a) || (bVar1 == 0x5f)) || (bVar1 == 0x2d)
                 ) {
                std::__cxx11::string::push_back(cVar20);
                while( true ) {
                  pcVar12 = input->_M_str;
                  input->_M_str = pcVar12 + 1;
                  input->_M_len = input->_M_len - 1;
                  if (input->_M_len == 0) break;
                  cVar21 = pcVar12[1];
                  if (((0x19 < ((int)cVar21 & 0xffffffdfU) - 0x41) && (cVar21 != '-')) &&
                     ((cVar21 != '_' && (9 < (int)cVar21 - 0x30U)))) break;
                  std::__cxx11::string::push_back(cVar20);
                }
                local_c8._0_8_ = local_f8._8_8_;
                local_c8.subSelectors.
                super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
                local_90.id = elementid((string_view *)&local_c8);
                bVar9 = true;
                if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
                  operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
                }
              }
              else {
                bVar9 = false;
              }
              sVar17 = input->_M_len;
            }
            bVar8 = false;
            if (sVar17 != 0) {
LAB_0011ae1e:
              pbVar11 = (byte *)input->_M_str;
              bVar1 = *pbVar11;
              if (0x39 < bVar1) {
                if (bVar1 == 0x3a) {
                  input->_M_str = (char *)(pbVar11 + 1);
                  bVar8 = true;
                  input->_M_len = sVar17 - 1;
                  local_f8._0_8_ = local_f8 + 0x10;
                  local_f8._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
                  if ((sVar17 - 1 == 0) ||
                     (((bVar1 = pbVar11[1], 0x19 < (int)(char)(bVar1 & 0xdf) - 0x41U &&
                       (bVar1 != 0x5f)) && (bVar1 != 0x2d)))) goto LAB_0011b58f;
                  std::__cxx11::string::push_back(cVar20);
                  while( true ) {
                    pcVar12 = input->_M_str;
                    input->_M_str = pcVar12 + 1;
                    input->_M_len = input->_M_len - 1;
                    if (input->_M_len == 0) break;
                    cVar21 = pcVar12[1];
                    if ((((0x19 < ((int)cVar21 & 0xffffffdfU) - 0x41) && (cVar21 != '-')) &&
                        (cVar21 != '_')) && (9 < (int)cVar21 - 0x30U)) break;
                    std::__cxx11::string::push_back(cVar20);
                  }
                  local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
                  local_c8.subSelectors.
                  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_c8.subSelectors.
                  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_c8.subSelectors.
                  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  iVar10 = std::__cxx11::string::compare(local_f8);
                  if (iVar10 == 0) {
                    local_c8.type = 1;
LAB_0011b557:
                    std::
                    vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
                    ::emplace_back<lunasvg::PseudoClassSelector>
                              (&local_90.pseudoClassSelectors,&local_c8);
                    bVar8 = false;
                  }
                  else {
                    iVar10 = std::__cxx11::string::compare(local_f8);
                    if (iVar10 == 0) {
                      local_c8.type = 2;
                      goto LAB_0011b557;
                    }
                    iVar10 = std::__cxx11::string::compare(local_f8);
                    if (iVar10 != 0) {
                      iVar10 = std::__cxx11::string::compare(local_f8);
                      if (iVar10 == 0) {
                        local_c8.type = 5;
                      }
                      else {
                        iVar10 = std::__cxx11::string::compare(local_f8);
                        if (iVar10 == 0) {
                          local_c8.type = 6;
                        }
                        else {
                          iVar10 = std::__cxx11::string::compare(local_f8);
                          if (iVar10 == 0) {
                            local_c8.type = 7;
                          }
                          else {
                            iVar10 = std::__cxx11::string::compare(local_f8);
                            if (iVar10 == 0) {
                              local_c8.type = 8;
                            }
                            else {
                              iVar10 = std::__cxx11::string::compare(local_f8);
                              if (iVar10 == 0) {
                                local_c8.type = 9;
                              }
                              else {
                                iVar10 = std::__cxx11::string::compare(local_f8);
                                if (iVar10 == 0) {
                                  local_c8.type = 10;
                                }
                                else if (local_c8.type - Is < 2) goto LAB_0011b33b;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_0011b557;
                    }
                    local_c8.type = 4;
LAB_0011b33b:
                    sVar17 = input->_M_len;
                    bVar8 = true;
                    if (sVar17 != 0) {
                      pbVar16 = (byte *)(input->_M_str + 2);
                      sVar14 = sVar17 - 2;
                      pbVar11 = (byte *)input->_M_str;
LAB_0011b35f:
                      pbVar19 = pbVar11 + 1;
                      sVar17 = sVar17 - 1;
                      uVar18 = (ulong)*pbVar11;
                      if (uVar18 < 0x29) {
                        if ((0x100002600U >> (uVar18 & 0x3f) & 1) != 0) goto code_r0x0011b377;
                        if (uVar18 == 0x28) {
                          input->_M_str = (char *)pbVar19;
                          input->_M_len = sVar17;
                          while (((uVar5 = sVar14, sVar17 != 0 &&
                                  ((ulong)*(byte *)((long)pbVar16 + -1) < 0x21)) &&
                                 ((0x100002600U >> ((ulong)*(byte *)((long)pbVar16 + -1) & 0x3f) & 1
                                  ) != 0))) {
                            input->_M_str = (char *)pbVar16;
                            input->_M_len = uVar5;
                            pbVar16 = (byte *)((long)pbVar16 + 1);
                            sVar14 = uVar5 - 1;
                            sVar17 = uVar5;
                          }
                          bVar9 = parseSelectors(input,&local_c8.subSelectors);
                          if ((bVar9) && (sVar17 = input->_M_len, sVar17 != 0)) {
                            pbVar11 = (byte *)input->_M_str;
                            while( true ) {
                              sVar17 = sVar17 - 1;
                              pbVar16 = pbVar11 + 1;
                              uVar18 = (ulong)*pbVar11;
                              if (0x29 < uVar18) goto LAB_0011b56c;
                              if ((0x100002600U >> (uVar18 & 0x3f) & 1) == 0) break;
                              input->_M_str = (char *)pbVar16;
                              input->_M_len = sVar17;
                              pbVar11 = pbVar16;
                              if (sVar17 == 0) goto LAB_0011b56c;
                            }
                            if (uVar18 != 0x29) goto LAB_0011b56c;
                            input->_M_str = (char *)pbVar16;
                            input->_M_len = sVar17;
                            goto LAB_0011b557;
                          }
                        }
                      }
                    }
                  }
LAB_0011b56c:
                  std::
                  vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ::~vector(&local_c8.subSelectors);
                  if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
                    operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
                  }
                  goto LAB_0011b58f;
                }
                if (bVar1 == 0x5b) {
                  input->_M_str = (char *)(pbVar11 + 1);
                  input->_M_len = sVar17 - 1;
                  local_c8._0_8_ =
                       &local_c8.subSelectors.
                        super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
                  local_c8.subSelectors.
                  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  uVar18 = (ulong)local_c8.subSelectors.
                                  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish >> 8;
                  local_c8.subSelectors.
                  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar18 << 8);
                  if (sVar17 - 1 != 0) {
                    pbVar11 = pbVar11 + 2;
                    sVar17 = sVar17 - 2;
                    do {
                      bVar1 = pbVar11[-1];
                      if ((0x20 < (ulong)bVar1) ||
                         ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                        if ((((int)(char)bVar1 & 0xffffffdfU) - 0x41 < 0x1a) ||
                           ((bVar1 == 0x5f || (bVar1 == 0x2d)))) {
                          local_c8.subSelectors.
                          super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          local_c8.subSelectors.
                          super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar18 << 8);
                          std::__cxx11::string::push_back((char)&local_c8);
                          pcVar12 = input->_M_str + 1;
                          input->_M_str = pcVar12;
                          input->_M_len = input->_M_len - 1;
                          sVar17 = input->_M_len;
                          goto joined_r0x0011b265;
                        }
                        break;
                      }
                      input->_M_str = (char *)pbVar11;
                      input->_M_len = sVar17;
                      pbVar11 = pbVar11 + 1;
                      bVar9 = sVar17 != 0;
                      sVar17 = sVar17 - 1;
                    } while (bVar9);
                  }
                  bVar4 = 0;
                  goto LAB_0011af6a;
                }
                goto LAB_0011b82a;
              }
              if (bVar1 != 0x23) {
                if (bVar1 == 0x2e) {
                  input->_M_str = (char *)(pbVar11 + 1);
                  bVar8 = true;
                  input->_M_len = sVar17 - 1;
                  local_f8._8_8_ = &local_e0;
                  local_f8._16_8_ = (char *)0x0;
                  local_e0._M_local_buf[0] = '\0';
                  local_f8._0_5_ = 0x300000000;
                  local_f8._0_4_ = 3;
                  if ((sVar17 - 1 != 0) &&
                     (((bVar1 = pbVar11[1], (int)(char)(bVar1 & 0xdf) - 0x41U < 0x1a ||
                       (bVar1 == 0x5f)) || (bVar1 == 0x2d)))) {
                    cVar21 = (char)local_f8 + '\b';
                    std::__cxx11::string::push_back(cVar21);
                    while( true ) {
                      pcVar12 = input->_M_str;
                      input->_M_str = pcVar12 + 1;
                      input->_M_len = input->_M_len - 1;
                      if (input->_M_len == 0) break;
                      cVar2 = pcVar12[1];
                      if (((0x19 < ((int)cVar2 & 0xffffffdfU) - 0x41) && (cVar2 != '-')) &&
                         ((cVar2 != '_' && (9 < (int)cVar2 - 0x30U)))) break;
                      std::__cxx11::string::push_back(cVar21);
                    }
                    std::
                    vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                    ::emplace_back<lunasvg::AttributeSelector>
                              (&local_90.attributeSelectors,(AttributeSelector *)local_f8);
LAB_0011b1e2:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._8_8_ != &local_e0) {
                      operator_delete((void *)local_f8._8_8_,
                                      CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                               local_e0._M_local_buf[0]) + 1);
                    }
                    bVar8 = false;
                  }
                  goto LAB_0011b58f;
                }
                goto LAB_0011b82a;
              }
              input->_M_str = (char *)(pbVar11 + 1);
              bVar8 = true;
              input->_M_len = sVar17 - 1;
              local_f8._8_8_ = &local_e0;
              local_f8._16_8_ = (char *)0x0;
              local_e0._M_local_buf[0] = '\0';
              local_f8._0_5_ = 0x1d00000000;
              local_f8._0_4_ = 1;
              if ((sVar17 - 1 != 0) &&
                 (((bVar1 = pbVar11[1], (int)(char)(bVar1 & 0xdf) - 0x41U < 0x1a || (bVar1 == 0x5f))
                  || (bVar1 == 0x2d)))) {
                cVar21 = (char)local_f8 + '\b';
                std::__cxx11::string::push_back(cVar21);
                while( true ) {
                  pcVar12 = input->_M_str;
                  input->_M_str = pcVar12 + 1;
                  input->_M_len = input->_M_len - 1;
                  if (input->_M_len == 0) break;
                  cVar2 = pcVar12[1];
                  if ((((0x19 < ((int)cVar2 & 0xffffffdfU) - 0x41) && (cVar2 != '-')) &&
                      (cVar2 != '_')) && (9 < (int)cVar2 - 0x30U)) break;
                  std::__cxx11::string::push_back(cVar21);
                }
                std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                ::emplace_back<lunasvg::AttributeSelector>
                          (&local_90.attributeSelectors,(AttributeSelector *)local_f8);
                goto LAB_0011b1e2;
              }
              goto LAB_0011b58f;
            }
LAB_0011b82a:
            if (!bVar9) goto LAB_0011b83a;
LAB_0011b82f:
            if (bVar8 != false) {
              local_c9 = 0;
              goto LAB_0011b83e;
            }
            bVar9 = true;
            std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::
            emplace_back<lunasvg::SimpleSelector>(&local_58,&local_90);
          }
          std::vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>::
          ~vector(&local_90.pseudoClassSelectors);
          std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::
          ~vector(&local_90.attributeSelectors);
          if (!bVar9) {
            if ((local_c9 & 1) == 0) {
              std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::
              ~vector(&local_58);
              return false;
            }
            goto LAB_0011b91e;
          }
          sVar17 = input->_M_len;
          bVar9 = false;
          if (sVar17 != 0) {
            pbVar11 = (byte *)input->_M_str;
            do {
              sVar17 = sVar17 - 1;
              if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
              break;
              input->_M_str = (char *)(pbVar11 + 1);
              input->_M_len = sVar17;
              bVar9 = true;
              pbVar11 = pbVar11 + 1;
            } while (sVar17 != 0);
          }
          bVar8 = skipDelimiterAndOptionalSpaces(input,'>');
          CVar6 = Child;
        } while (bVar8);
        bVar8 = skipDelimiterAndOptionalSpaces(input,'+');
        CVar6 = DirectAdjacent;
      } while (bVar8);
      bVar8 = skipDelimiterAndOptionalSpaces(input,'~');
      CVar6 = (uint)bVar8 * 3 + Descendant;
    } while (bVar9 || bVar8);
LAB_0011b91e:
    std::
    vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
    ::emplace_back<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>
              (local_38,&local_58);
    std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::~vector
              (&local_58);
    bVar9 = skipDelimiterAndOptionalSpaces(input,',');
    if (!bVar9) {
      return true;
    }
  } while( true );
code_r0x0011b377:
  input->_M_str = (char *)pbVar19;
  input->_M_len = sVar17;
  pbVar16 = pbVar16 + 1;
  sVar14 = sVar14 - 1;
  pbVar11 = pbVar19;
  if (sVar17 == 0) goto LAB_0011b56c;
  goto LAB_0011b35f;
joined_r0x0011b265:
  if (sVar17 == 0) goto LAB_0011b2a7;
  cVar21 = *pcVar12;
  if ((((0x19 < ((int)cVar21 & 0xffffffdfU) - 0x41) && (cVar21 != '-')) && (cVar21 != '_')) &&
     (9 < (int)cVar21 - 0x30U)) goto LAB_0011b2a7;
  std::__cxx11::string::push_back((char)&local_c8);
  pcVar12 = input->_M_str + 1;
  input->_M_str = pcVar12;
  input->_M_len = input->_M_len - 1;
  sVar17 = input->_M_len;
  goto joined_r0x0011b265;
LAB_0011b2a7:
  local_f8._5_3_ = (undefined3)((ulong)local_f8._0_8_ >> 0x28);
  local_f8._0_4_ = None;
  local_f8[4] = Unknown;
  local_f8._8_8_ = &local_e0;
  local_f8._16_8_ = (char *)0x0;
  local_e0._M_local_buf[0] = '\0';
  local_a8._M_len =
       (size_t)local_c8.subSelectors.
               super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_a8._M_str = (char *)local_c8._0_8_;
  PVar7 = propertyid(&local_a8);
  uVar3 = CONCAT31(local_f8._5_3_,PVar7);
  local_f8._0_8_ = (ulong)uVar3 << 0x20;
  if ((input->_M_len == 0) || (*input->_M_str != '=')) {
    local_a8._M_len = 2;
    local_a8._M_str = "*=";
    bVar9 = skipString(input,&local_a8);
    if (bVar9) {
      local_f8._0_4_ = 2;
    }
    else {
      local_a8._M_len = 2;
      local_a8._M_str = "~=";
      bVar9 = skipString(input,&local_a8);
      if (bVar9) {
        local_f8._0_4_ = 3;
      }
      else {
        local_a8._M_len = 2;
        local_a8._M_str = "^=";
        bVar9 = skipString(input,&local_a8);
        if (bVar9) {
          local_f8._0_4_ = 4;
        }
        else {
          local_a8._M_len = 2;
          local_a8._M_str = "$=";
          bVar9 = skipString(input,&local_a8);
          if (bVar9) {
            local_f8._0_4_ = 5;
          }
          else {
            local_a8._M_len = 2;
            local_a8._M_str = "|=";
            bVar9 = skipString(input,&local_a8);
            if (bVar9) {
              local_f8._0_4_ = 6;
            }
            else if (local_f8._0_4_ == None) {
              pcVar12 = (char *)input->_M_len;
LAB_0011b7b1:
              if (pcVar12 != (char *)0x0) {
                pbVar11 = (byte *)input->_M_str;
LAB_0011b7c4:
                do {
                  pcVar12 = pcVar12 + -1;
                  pbVar16 = pbVar11 + 1;
                  bVar1 = *pbVar11;
                  if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                    if (bVar1 != 0x5d) goto LAB_0011b5f6;
                    input->_M_str = (char *)pbVar16;
                    input->_M_len = (size_t)pcVar12;
                    bVar4 = 1;
                    std::
                    vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                    ::emplace_back<lunasvg::AttributeSelector>
                              (&local_90.attributeSelectors,(AttributeSelector *)local_f8);
                    break;
                  }
                  input->_M_str = (char *)pbVar16;
                  input->_M_len = (size_t)pcVar12;
                  bVar4 = 0;
                  pbVar11 = pbVar16;
                } while (pcVar12 != (char *)0x0);
                goto LAB_0011b5f9;
              }
              goto LAB_0011b5f6;
            }
          }
        }
      }
    }
    sVar13 = input->_M_len;
  }
  else {
    input->_M_str = input->_M_str + 1;
    sVar13 = input->_M_len - 1;
    input->_M_len = sVar13;
    local_f8._4_4_ = uVar3;
    local_f8._0_4_ = 1;
  }
  if (sVar13 != 0) {
    pcVar12 = input->_M_str;
    sVar22 = 0;
    __n = sVar13;
    do {
      __n = __n - 1;
      bVar1 = pcVar12[sVar22];
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        if (0x19 < ((int)(char)bVar1 & 0xffffffdfU) - 0x41) {
          bVar4 = 0;
          if (bVar1 < 0x2d) {
            if ((bVar1 != 0x22) && (bVar1 != 0x27)) goto LAB_0011b5f9;
            __s = pcVar12 + sVar22 + 1;
            input->_M_str = __s;
            input->_M_len = __n;
            if ((sVar13 - 1 != sVar22) &&
               (local_40 = __s, pvVar15 = memchr(__s,(int)(char)bVar1,__n),
               (long)pvVar15 - (long)pcVar12 != sVar22 && pvVar15 != (void *)0x0)) {
              std::__cxx11::string::_M_replace
                        ((ulong)(local_f8 + 8),0,(char *)local_f8._16_8_,(ulong)local_40);
              input->_M_str = input->_M_str + (long)pvVar15 + (-sVar22 - (long)pcVar12);
              pcVar12 = pcVar12 + (input->_M_len - (long)pvVar15) + sVar22;
              input->_M_len = (size_t)pcVar12;
              goto LAB_0011b7b1;
            }
            break;
          }
          if ((bVar1 != 0x5f) && (bVar1 != 0x2d)) goto LAB_0011b5f9;
        }
        local_f8._16_8_ = (char *)0x0;
        *(char *)local_f8._8_8_ = '\0';
        std::__cxx11::string::push_back((char)local_f8 + '\b');
        pbVar11 = (byte *)(input->_M_str + 1);
        input->_M_str = (char *)pbVar11;
        pcVar12 = (char *)(input->_M_len - 1);
        input->_M_len = (size_t)pcVar12;
        if (pcVar12 != (char *)0x0) {
          goto LAB_0011b697;
        }
        break;
      }
      input->_M_str = pcVar12 + sVar22 + 1;
      input->_M_len = __n;
      sVar22 = sVar22 + 1;
    } while (sVar13 != sVar22);
  }
  goto LAB_0011b5f6;
  while( true ) {
    std::__cxx11::string::push_back((char)local_f8 + '\b');
    pbVar11 = (byte *)(input->_M_str + 1);
    input->_M_str = (char *)pbVar11;
    pcVar12 = (char *)(input->_M_len - 1);
    input->_M_len = (size_t)pcVar12;
    if (pcVar12 == (char *)0x0) break;
LAB_0011b697:
    bVar1 = *pbVar11;
    if ((((0x19 < ((int)(char)bVar1 & 0xffffffdfU) - 0x41) && (bVar1 != 0x2d)) && (bVar1 != 0x5f))
       && (9 < (int)(char)bVar1 - 0x30U)) goto LAB_0011b7c4;
  }
LAB_0011b5f6:
  bVar4 = 0;
LAB_0011b5f9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._8_8_ != &local_e0) {
    operator_delete((void *)local_f8._8_8_,
                    CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
  }
  if ((pointer *)local_c8._0_8_ !=
      &local_c8.subSelectors.
       super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)local_c8._0_8_,
                    (ulong)((long)&((local_c8.subSelectors.
                                     super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->
                                   super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_0011af6a:
  bVar8 = (bool)(bVar4 ^ 1);
LAB_0011b58f:
  if (bVar8) goto LAB_0011b82f;
  sVar17 = input->_M_len;
  bVar9 = true;
  if (sVar17 == 0) goto LAB_0011b82f;
  goto LAB_0011ae1e;
}

Assistant:

static bool parseSelectors(std::string_view& input, SelectorList& selectors)
{
    do {
        Selector selector;
        if(!parseSelector(input, selector))
            return false;
        selectors.push_back(std::move(selector));
    } while(skipDelimiterAndOptionalSpaces(input, ','));
    return true;
}